

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_buffer.cpp
# Opt level: O0

packet * __thiscall libtorrent::aux::packet_buffer::at(packet_buffer *this,index_type idx)

{
  bool bVar1;
  unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *this_00;
  size_t mask;
  index_type idx_local;
  packet_buffer *this_local;
  
  if (idx < this->m_first + this->m_capacity) {
    bVar1 = compare_less_wrap(idx,this->m_first,0xffff);
    if (bVar1) {
      this_local = (packet_buffer *)0x0;
    }
    else {
      this_00 = unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
                ::operator[](&this->m_storage,idx & this->m_capacity - 1);
      this_local = (packet_buffer *)
                   ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::get
                             (this_00);
    }
  }
  else {
    this_local = (packet_buffer *)0x0;
  }
  return (packet *)this_local;
}

Assistant:

packet* packet_buffer::at(index_type idx) const
	{
		INVARIANT_CHECK;
		if (idx >= m_first + m_capacity)
			return nullptr;

		if (compare_less_wrap(idx, m_first, 0xffff))
			return nullptr;

		std::size_t const mask = m_capacity - 1;
		return m_storage[idx & mask].get();
	}